

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
::_insert<std::initializer_list<unsigned_int>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
           *this,initializer_list<unsigned_int> *column,Index columnIndex,Dimension dim)

{
  long lVar1;
  iterator iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint local_44;
  Index local_40;
  Dimension local_3c;
  Dimension local_38;
  Index local_34;
  
  local_40 = columnIndex;
  if (this[0x30] ==
      (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
       )0x1) {
    local_3c = dim;
    if (*(int *)(this + 0x58) != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar3 = (*(long *)(this + 0x48) - *(long *)(this + 0x40) >> 3) * 0x6db6db6db6db6db7;
        if (uVar3 < uVar6 || uVar3 - uVar6 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6);
        }
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
        ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
                    *)(*(long *)(this + 0x40) + lVar5),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x18),(Index)uVar6
                  );
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x38;
      } while (uVar6 < *(uint *)(this + 0x58));
    }
    if (*(int *)(this + 0x58) != 0) {
      lVar5 = *(long *)this;
      lVar1 = *(long *)(this + 0x18);
      uVar6 = 0;
      do {
        *(int *)(lVar5 + uVar6 * 4) = (int)uVar6;
        *(int *)(lVar1 + uVar6 * 4) = (int)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)(this + 0x58));
    }
    this[0x30] = (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>
                  )0x0;
    dim = local_3c;
  }
  if (column->_M_len == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = column->_M_array[column->_M_len - 1];
  }
  uVar6 = (ulong)(*(long *)(this + 8) - *(long *)this) >> 2;
  if ((uint)uVar6 <= uVar4) {
    local_44 = (uint)uVar6;
    do {
      iVar2._M_current = *(uint **)(this + 8);
      if (iVar2._M_current == *(uint **)(this + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar2,&local_44);
      }
      else {
        *iVar2._M_current = (uint)uVar6;
        *(uint **)(this + 8) = iVar2._M_current + 1;
      }
      iVar2._M_current = *(uint **)(this + 0x20);
      if (iVar2._M_current == *(uint **)(this + 0x28)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)(this + 0x18),iVar2,
                   &local_44);
      }
      else {
        *iVar2._M_current = local_44;
        *(uint **)(this + 0x20) = iVar2._M_current + 1;
      }
      local_44 = local_44 + 1;
      uVar6 = (ulong)local_44;
    } while (local_44 <= uVar4);
  }
  local_38 = dim;
  local_34 = local_40;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>>>
  ::
  emplace_back<unsigned_int&,std::initializer_list<unsigned_int>const&,int&,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,true,false>>>>>
              *)(this + 0x40),&local_34,column,&local_38,
             (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_true,_false>_>_>_>_>_>_>_>
              **)(this + 0x38),(Column_z2_settings **)(this + 0x60));
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::_insert(const Container& column, Index columnIndex, Dimension dim)
{
  _orderRowsIfNecessary();

  //resize of containers when necessary:
  Index pivot = 0;
  if (column.begin() != column.end()) {
    //first, compute pivot of `column`
    if constexpr (Master_matrix::Option_list::is_z2) {
      pivot = *std::prev(column.end());
    } else {
      pivot = std::prev(column.end())->first;
    }
    //row container
    if constexpr (Master_matrix::Option_list::has_row_access && !Master_matrix::Option_list::has_removable_rows)
      if (RA_opt::rows_->size() <= pivot) RA_opt::rows_->resize(pivot + 1);
  }

  //row swap map containers
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_column_and_row_swaps || Master_matrix::Option_list::has_vine_update) {
      for (auto id : column) {
        Index idx;
        if constexpr (Master_matrix::Option_list::is_z2) {
          idx = id;
        } else {
          idx = id.first;
        }
        Swap_opt::indexToRow_[idx] = idx;
        Swap_opt::rowToIndex_[idx] = idx;
      }
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_column_and_row_swaps || Master_matrix::Option_list::has_vine_update) {
      Index size = Swap_opt::indexToRow_.size();
      if (size <= pivot) {
        for (Index i = size; i <= pivot; i++) {
          Swap_opt::indexToRow_.push_back(i);
          Swap_opt::rowToIndex_.push_back(i);
        }
      }
    }
    //column container
    if constexpr (!Master_matrix::Option_list::has_row_access) {
      if (matrix_.size() <= columnIndex) {
        matrix_.resize(columnIndex + 1);
      }
    }
  }

  _container_insert(column, columnIndex, dim);
}